

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O2

void clean_msgs(borg_read_messages *msgs)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < msgs->count; lVar2 = lVar2 + 1) {
    string_free(*(char **)((long)&msgs->messages->message_p1 + lVar1));
    string_free(*(char **)((long)&msgs->messages->message_p2 + lVar1));
    string_free(*(char **)((long)&msgs->messages->message_p3 + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  mem_free(msgs->messages);
  msgs->messages = (borg_read_message *)0x0;
  mem_free(msgs->index);
  msgs->index = (int *)0x0;
  msgs->count = 0;
  msgs->allocated = 0;
  return;
}

Assistant:

static void clean_msgs(struct borg_read_messages *msgs)
{
    int i;

    for (i = 0; i < msgs->count; ++i) {
        string_free(msgs->messages[i].message_p1);
        string_free(msgs->messages[i].message_p2);
        string_free(msgs->messages[i].message_p3);
    }
    mem_free(msgs->messages);
    msgs->messages = NULL;
    mem_free(msgs->index);
    msgs->index     = NULL;
    msgs->count     = 0;
    msgs->allocated = 0;
}